

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O2

void __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
          (GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *this,bool CreateObject,
          GLTextureCreateReleaseHelper CreateReleaseHelper)

{
  undefined7 in_register_00000031;
  
  this->m_uiHandle = 0;
  (this->m_CreateReleaseHelper).m_ExternalGLTextureHandle =
       CreateReleaseHelper.m_ExternalGLTextureHandle;
  (this->m_UniqueId).m_ID = 0;
  if ((int)CONCAT71(in_register_00000031,CreateObject) != 0) {
    Create(this);
    if (this->m_uiHandle == 0) {
      Diligent::LogError<true,char[18],char_const*,char[11]>
                (false,"GLObjWrapper",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
                 ,0x32,(char (*) [18])"Failed to create ",
                 (char **)&GLTextureCreateReleaseHelper::Name,(char (*) [11])0x2b5e02);
    }
  }
  return;
}

Assistant:

explicit GLObjWrapper(bool CreateObject, CreateReleaseHelperType CreateReleaseHelper = CreateReleaseHelperType()) :
        // clang-format off
        m_uiHandle           {0                  },
        m_CreateReleaseHelper{CreateReleaseHelper}
    // clang-format on
    {
        if (CreateObject)
        {
            Create();
            if (!m_uiHandle)
            {
                LOG_ERROR_AND_THROW("Failed to create ", m_CreateReleaseHelper.Name, " GL object");
            }
        }
    }